

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O0

bool __thiscall
cmStringCommand::HandleRegexCommand
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  bool bVar1;
  size_type sVar2;
  undefined1 local_f8 [8];
  string e;
  string local_d0;
  allocator local_a9;
  string local_a8;
  allocator local_81;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  string *mode;
  allocator local_41;
  string local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmStringCommand *this_local;
  
  local_20 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar2 < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_40,"sub-command REGEX requires a mode to be specified.",&local_41);
    cmCommand::SetError(&this->super_cmCommand,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    this_local._7_1_ = 0;
  }
  else {
    local_60 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_20,1);
    bVar1 = std::operator==(local_60,"MATCH");
    if (bVar1) {
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(local_20);
      if (sVar2 < 5) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_80,
                   "sub-command REGEX, mode MATCH needs at least 5 arguments total to command.",
                   &local_81);
        cmCommand::SetError(&this->super_cmCommand,&local_80);
        std::__cxx11::string::~string((string *)&local_80);
        std::allocator<char>::~allocator((allocator<char> *)&local_81);
        this_local._7_1_ = 0;
      }
      else {
        this_local._7_1_ = RegexMatch(this,local_20);
      }
    }
    else {
      bVar1 = std::operator==(local_60,"MATCHALL");
      if (bVar1) {
        sVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(local_20);
        if (sVar2 < 5) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_a8,
                     "sub-command REGEX, mode MATCHALL needs at least 5 arguments total to command."
                     ,&local_a9);
          cmCommand::SetError(&this->super_cmCommand,&local_a8);
          std::__cxx11::string::~string((string *)&local_a8);
          std::allocator<char>::~allocator((allocator<char> *)&local_a9);
          this_local._7_1_ = 0;
        }
        else {
          this_local._7_1_ = RegexMatchAll(this,local_20);
        }
      }
      else {
        bVar1 = std::operator==(local_60,"REPLACE");
        if (bVar1) {
          sVar2 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(local_20);
          if (sVar2 < 6) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_d0,
                       "sub-command REGEX, mode REPLACE needs at least 6 arguments total to command."
                       ,(allocator *)(e.field_2._M_local_buf + 0xf));
            cmCommand::SetError(&this->super_cmCommand,&local_d0);
            std::__cxx11::string::~string((string *)&local_d0);
            std::allocator<char>::~allocator((allocator<char> *)(e.field_2._M_local_buf + 0xf));
            this_local._7_1_ = 0;
          }
          else {
            this_local._7_1_ = RegexReplace(this,local_20);
          }
        }
        else {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_f8,"sub-command REGEX does not recognize mode ",local_60);
          cmCommand::SetError(&this->super_cmCommand,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_f8);
          this_local._7_1_ = 0;
          std::__cxx11::string::~string((string *)local_f8);
        }
      }
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmStringCommand::HandleRegexCommand(std::vector<std::string> const& args)
{
  if (args.size() < 2) {
    this->SetError("sub-command REGEX requires a mode to be specified.");
    return false;
  }
  std::string const& mode = args[1];
  if (mode == "MATCH") {
    if (args.size() < 5) {
      this->SetError("sub-command REGEX, mode MATCH needs "
                     "at least 5 arguments total to command.");
      return false;
    }
    return this->RegexMatch(args);
  }
  if (mode == "MATCHALL") {
    if (args.size() < 5) {
      this->SetError("sub-command REGEX, mode MATCHALL needs "
                     "at least 5 arguments total to command.");
      return false;
    }
    return this->RegexMatchAll(args);
  }
  if (mode == "REPLACE") {
    if (args.size() < 6) {
      this->SetError("sub-command REGEX, mode REPLACE needs "
                     "at least 6 arguments total to command.");
      return false;
    }
    return this->RegexReplace(args);
  }

  std::string e = "sub-command REGEX does not recognize mode " + mode;
  this->SetError(e);
  return false;
}